

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O3

void mcsini(mcscxdef *ctx,mcmcx1def *gmemctx,ulong maxsiz,osfildef *fp,char *swapfilename,
           errcxdef *errctx)

{
  mcsdsdef **__s;
  size_t sVar1;
  uchar *__dest;
  
  ctx->mcscxtab = (mcsdsdef **)0x0;
  __s = (mcsdsdef **)mchalo(errctx,0x2000,"mcsini");
  ctx->mcscxtab = __s;
  memset(__s,0,0x800);
  *ctx->mcscxtab = (mcsdsdef *)(__s + 0x100);
  ctx->mcscxtop = 0;
  ctx->mcscxmax = maxsiz;
  ctx->mcscxmsg = 0;
  ctx->mcscxfp = fp;
  ctx->mcscxerr = errctx;
  ctx->mcscxmem = gmemctx;
  if (swapfilename != (char *)0x0) {
    sVar1 = strlen(swapfilename);
    __dest = mchalo(errctx,sVar1 + 1,"mcsini");
    ctx->mcscxfname = (char *)__dest;
    strcpy((char *)__dest,swapfilename);
    return;
  }
  ctx->mcscxfname = (char *)0x0;
  return;
}

Assistant:

void mcsini(mcscxdef *ctx, mcmcx1def *gmemctx, ulong maxsiz,
            osfildef *fp, char *swapfilename, errcxdef *errctx)
{
    uchar  *p;

    ctx->mcscxtab = (mcsdsdef **)0;                   /* anticipate failure */
    
    /* allocate space from the low-level heap for page table and one page */
    p = mchalo(errctx, ((MCSPAGETAB * sizeof(mcsdsdef *))
                        + (MCSPAGECNT * sizeof(mcsdsdef))), "mcsini");
    
    /* set up the context with pointers to this chunk */
    ctx->mcscxtab = (mcsdsdef **)p;
    memset(p, 0, (size_t)(MCSPAGETAB * sizeof(mcsdsdef *)));
    p += MCSPAGETAB * sizeof(mcsdsdef *);
    ctx->mcscxtab[0] = (mcsdsdef *)p;
    
    /* set up the rest of the context */
    ctx->mcscxtop = (ulong)0;
    ctx->mcscxmax = maxsiz;
    ctx->mcscxmsg = 0;
    ctx->mcscxfp  = fp;
    ctx->mcscxerr = errctx;
    ctx->mcscxmem = gmemctx;

    /* 
     *   store the swap filename - make a copy so that the caller doesn't
     *   have to retain the original copy (in case it's on the stack) 
     */
    if (swapfilename != 0)
    {
        ctx->mcscxfname = (char *)mchalo(errctx,
                                         (strlen(swapfilename)+1),
                                         "mcsini");
        strcpy(ctx->mcscxfname, swapfilename);
    }
    else
        ctx->mcscxfname = 0;
}